

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O0

void __thiscall
ConfidentialTransactionContext_AddPegoutTxOut2_Test::TestBody
          (ConfidentialTransactionContext_AddPegoutTxOut2_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Amount AVar3;
  AssertionResult gtest_ar;
  ConfidentialTransactionContext txc;
  undefined8 in_stack_fffffffffffff888;
  Address *in_stack_fffffffffffff890;
  Address *this_00;
  undefined4 in_stack_fffffffffffff8a0;
  undefined4 in_stack_fffffffffffff8a4;
  ConfidentialAssetId *in_stack_fffffffffffff8e8;
  allocator *paVar4;
  Amount *in_stack_fffffffffffff8f0;
  Address *in_stack_fffffffffffff8f8;
  ConfidentialTransactionContext *in_stack_fffffffffffff900;
  AssertHelper local_6c0;
  Message local_6b8;
  string local_6b0;
  AssertionResult local_690;
  allocator local_679;
  string local_678;
  ConfidentialAssetId local_658;
  int64_t local_630;
  undefined1 local_628;
  Amount local_620;
  ByteData local_610;
  allocator local_5f1;
  string local_5f0 [32];
  undefined1 local_5d0 [63];
  allocator local_591;
  string local_590 [11];
  NetType in_stack_fffffffffffffbec;
  Address *in_stack_fffffffffffffbf0;
  BlockHash *in_stack_fffffffffffffbf8;
  ConfidentialAssetId *in_stack_fffffffffffffc00;
  Amount *in_stack_fffffffffffffc08;
  ConfidentialTransactionContext *in_stack_fffffffffffffc10;
  undefined8 in_stack_fffffffffffffc20;
  undefined8 in_stack_fffffffffffffc28;
  string *in_stack_fffffffffffffc30;
  uint32_t in_stack_fffffffffffffc38;
  ByteData *in_stack_fffffffffffffc40;
  NetType in_stack_fffffffffffffc48;
  Address *in_stack_fffffffffffffc50;
  string local_3a8;
  ConfidentialAssetId local_388;
  int64_t local_360;
  undefined1 local_358;
  int64_t local_350;
  undefined1 local_348;
  allocator local_339;
  string local_338;
  ConfidentialAssetId local_318;
  int64_t local_2f0;
  undefined1 local_2e8;
  int64_t local_2e0;
  undefined1 local_2d8;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_2d0;
  allocator local_2b1;
  string local_2b0;
  Address local_290;
  allocator local_101;
  string local_100;
  Txid local_e0;
  ConfidentialTransaction local_c0 [3];
  
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)in_stack_fffffffffffff890,
             (uint32_t)((ulong)in_stack_fffffffffffff888 >> 0x20),
             (uint32_t)in_stack_fffffffffffff888);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_100,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,&local_101);
  cfd::core::Txid::Txid(&local_e0,&local_100);
  cfd::core::ConfidentialTransaction::AddTxIn
            (local_c0,&local_e0,0,0xfffffffd,(Script *)cfd::core::Script::Empty);
  cfd::core::Txid::~Txid((Txid *)0x21dabf);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b0,"XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA",&local_2b1)
  ;
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address(&local_290,&local_2b0,&local_2d0);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0xbefe33cc397c);
  local_2f0 = AVar3.amount_;
  local_2e8 = AVar3.ignore_check_;
  local_2e0 = local_2f0;
  local_2d8 = local_2e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_338,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,&local_339);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_318,&local_338);
  cfd::ConfidentialTransactionContext::AddTxOut
            (in_stack_fffffffffffff900,in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,
             in_stack_fffffffffffff8e8);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x21dc14);
  std::__cxx11::string::~string((string *)&local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  cfd::core::Address::~Address(in_stack_fffffffffffff890);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             CONCAT44(in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0));
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(1000000000);
  local_360 = AVar3.amount_;
  local_358 = AVar3.ignore_check_;
  paVar4 = (allocator *)&stack0xfffffffffffffc57;
  local_350 = local_360;
  local_348 = local_358;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3a8,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,paVar4);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_388,&local_3a8);
  paVar4 = (allocator *)&stack0xfffffffffffffc0f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffc10,
             "0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206",paVar4);
  cfd::core::BlockHash::BlockHash
            ((BlockHash *)&stack0xfffffffffffffc30,(string *)&stack0xfffffffffffffc10);
  paVar4 = &local_591;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_590,"2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo",paVar4);
  cfd::core::Address::Address((Address *)(local_590 + 1),local_590);
  cfd::core::Pubkey::Pubkey((Pubkey *)(local_5d0 + 0x20));
  cfd::core::Privkey::Privkey((Privkey *)local_5d0);
  paVar4 = &local_5f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5f0,"",paVar4);
  cfd::core::ByteData::ByteData(&local_610);
  this_00 = (Address *)local_5d0;
  cfd::ConfidentialTransactionContext::AddPegoutTxOut
            (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00,
             in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec,
             (Pubkey *)in_stack_fffffffffffffc20,(Privkey *)in_stack_fffffffffffffc28,
             in_stack_fffffffffffffc30,in_stack_fffffffffffffc38,in_stack_fffffffffffffc40,
             in_stack_fffffffffffffc48,in_stack_fffffffffffffc50);
  cfd::core::ByteData::~ByteData((ByteData *)0x21de66);
  std::__cxx11::string::~string(local_5f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5f1);
  cfd::core::Privkey::~Privkey((Privkey *)0x21de8d);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x21de9a);
  cfd::core::Address::~Address(this_00);
  std::__cxx11::string::~string((string *)local_590);
  std::allocator<char>::~allocator((allocator<char> *)&local_591);
  cfd::core::BlockHash::~BlockHash((BlockHash *)0x21dece);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffc10);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc0f);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x21def5);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc57);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0x1c84);
  local_630 = AVar3.amount_;
  local_628 = AVar3.ignore_check_;
  local_620.amount_ = local_630;
  local_620.ignore_check_ = (bool)local_628;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_678,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,&local_679);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_658,&local_678);
  cfd::core::ConfidentialTransaction::AddTxOutFee(local_c0,&local_620,&local_658);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x21dfca);
  std::__cxx11::string::~string((string *)&local_678);
  std::allocator<char>::~allocator((allocator<char> *)&local_679);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            (&local_6b0,&local_c0[0].super_AbstractTransaction);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_690,"txc.GetHex().c_str()",
             "\"020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00003a6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000\""
             ,pcVar2,
             "020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00003a6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000"
            );
  std::__cxx11::string::~string((string *)&local_6b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_690);
  if (!bVar1) {
    testing::Message::Message(&local_6b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x21e46e);
    testing::internal::AssertHelper::AssertHelper
              (&local_6c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x15b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_6c0,&local_6b8);
    testing::internal::AssertHelper::~AssertHelper(&local_6c0);
    testing::Message::~Message((Message *)0x21e4cb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x21e520);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)this_00);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, AddPegoutTxOut2)
{
    ConfidentialTransactionContext txc(2, 0);
    txc.AddTxIn(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 0, 4294967293);
    txc.AddTxOut(
        Address("XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA", cfd::core::GetElementsAddressFormatList()),
        Amount::CreateBySatoshiAmount(209998999992700),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));
    txc.AddPegoutTxOut(
        Amount::CreateBySatoshiAmount(1000000000),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"),
        BlockHash("0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"),
        Address("2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo"));
    txc.AddTxOutFee(
        Amount::CreateBySatoshiAmount(7300),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));

    EXPECT_STREQ(txc.GetHex().c_str(), "020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00003a6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000");

}